

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_NetworkList_Test::TestBody(InterpreterTestSuite_PC_NetworkList_Test *this)

{
  Status SVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *expected_predicate_value;
  char *pcVar2;
  Status local_4f2;
  allocator local_4f1;
  allocator local_4f0;
  allocator local_4ef;
  allocator local_4ee;
  allocator local_4ed;
  allocator local_4ec;
  allocator local_4eb;
  allocator local_4ea;
  Status local_4e9;
  AssertionResult gtest_ar_1;
  Expression expr;
  Value local_4b8;
  Registry *local_470;
  string local_468;
  State local_448;
  State local_444;
  Value value;
  string local_3f8;
  AssertionResult gtest_ar_;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_398;
  Network nwk;
  UnixTime local_318;
  UnixTime local_310;
  string local_308;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  nwk.mId.mId = 0;
  nwk.mDomainId.mId = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&nwk);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&nwk);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x68e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&br.mId;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&br.mId);
    local_470 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&nwk,"127.0.0.1",&local_4ea);
    local_398._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_398._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&value,"1.1",&local_4eb);
    ot::commissioner::BorderAgent::State::State(&local_444,0,0,0,0,0);
    std::__cxx11::string::string((string *)&local_4b8,"net1",&local_4ec);
    std::__cxx11::string::string((string *)&expr,"",&local_4ed);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4ee);
    std::__cxx11::string::string((string *)&local_468,"",&local_4ef);
    local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_3f8,"domain1",&local_4f0);
    pcVar2 = "";
    std::__cxx11::string::string((string *)&local_308,"",&local_4f1);
    ot::commissioner::UnixTime::UnixTime(&local_310,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&nwk,0x4e21,(ByteArray *)&local_398,(string *)&value,
               local_444,(string *)&local_4b8,1,(string *)&expr,(string *)&gtest_ar_,(Timestamp)0x0,
               0,&local_468,(ByteArray *)&local_3b8,&local_3f8,'\0',0,&local_308,local_310,0xfffff);
    local_4e9 = ot::commissioner::persistent_storage::Registry::Add(local_470,(BorderAgent *)&br);
    local_4f2 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0xFFFFF})"
               ,"RegistryStatus::kSuccess",&local_4e9,&local_4f2);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_398);
    std::__cxx11::string::~string((string *)&nwk);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x692,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_00 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      local_470 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&nwk,"127.0.0.2",&local_4ea);
      local_398._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&value,"1.1",&local_4eb);
      ot::commissioner::BorderAgent::State::State(&local_448,0,0,0,0,0);
      std::__cxx11::string::string((string *)&local_4b8,"net2",&local_4ec);
      std::__cxx11::string::string((string *)&expr,"",&local_4ed);
      std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4ee);
      std::__cxx11::string::string((string *)&local_468,"",&local_4ef);
      local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_3f8,"domain1",&local_4f0);
      pcVar2 = "";
      std::__cxx11::string::string((string *)&local_308,"",&local_4f1);
      ot::commissioner::UnixTime::UnixTime(&local_318,0);
      expected_predicate_value = (char *)(ulong)(uint)local_448;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&nwk,0x4e22,(ByteArray *)&local_398,(string *)&value,
                 local_448,(string *)&local_4b8,2,(string *)&expr,(string *)&gtest_ar_,
                 (Timestamp)0x0,0,&local_468,(ByteArray *)&local_3b8,&local_3f8,'\0',0,&local_308,
                 local_318,0xfffff);
      local_4e9 = ot::commissioner::persistent_storage::Registry::Add(local_470,(BorderAgent *)&br);
      local_4f2 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0xFFFFF})"
                 ,"RegistryStatus::kSuccess",&local_4e9,&local_4f2);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&value);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_398);
      std::__cxx11::string::~string((string *)&nwk);
      if (gtest_ar_1.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
        ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk.mId,0);
        br.mNetworkId = nwk.mId;
        SVar1 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br)
        ;
        value.mError.mCode = CONCAT31(value.mError.mCode._1_3_,SVar1);
        local_4b8.mError.mCode = local_4b8.mError.mCode & 0xffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwk,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",(Status *)&value,(Status *)&local_4b8);
        if ((char)nwk.mId.mId == '\0') {
          testing::Message::Message((Message *)&value);
          if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)nwk.mName._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x699,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_4b8,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
          if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
          ot::commissioner::persistent_storage::Network::Network(&nwk);
          SVar1 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                            (ctx.mRegistry,&nwk);
          local_4b8.mError.mCode = CONCAT31(local_4b8.mError.mCode._1_3_,SVar1);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)expr.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",(Status *)&local_4b8,(Status *)&expr);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&local_4b8);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&expr,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x69c,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&local_4b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
            if ((long *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          local_4b8.mError.mCode = kNone;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&value,"nwk.mId.mId","0",(uint *)&nwk,(int *)&local_4b8);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&local_4b8);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&expr,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x69d,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&local_4b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
            if ((long *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          value.mError.mCode = kNone;
          value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string
                    ((string *)&local_4b8,"Network list --dom domain1",(allocator *)&local_468);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&local_4b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&local_4b8);
          ot::commissioner::Interpreter::Eval(&local_4b8,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,&local_4b8);
          ot::commissioner::Interpreter::Value::~Value(&local_4b8);
          gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_468);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_4b8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_3f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x6a4,(char *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_3f8,(Message *)&local_468);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_4b8);
            if ((long *)local_468._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_468._M_dataplus._M_p + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::__cxx11::string::string
                    ((string *)&local_4b8,"Network list --nwk other",(allocator *)&local_468);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&local_4b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&local_4b8);
          ot::commissioner::Interpreter::Eval(&local_4b8,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,&local_4b8);
          ot::commissioner::Interpreter::Value::~Value(&local_4b8);
          gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_468);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_4b8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_3f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x6a8,(char *)CONCAT44(local_4b8.mError._4_4_,local_4b8.mError.mCode));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_3f8,(Message *)&local_468);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_4b8);
            if ((long *)local_468._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_468._M_dataplus._M_p + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ot::commissioner::Interpreter::Value::~Value(&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&expr);
          ot::commissioner::persistent_storage::Network::~Network(&nwk);
        }
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
        goto LAB_00165303;
      }
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x696,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_00 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
LAB_00165303:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkList)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0xFFFFF}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0xFFFFF}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network list --dom domain1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("Network list --nwk other");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}